

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattice.c
# Opt level: O2

void WebRtcIsac_NormLatticeFilterMa
               (int orderCoef,float *stateF,float *stateG,float *lat_in,double *filtcoeflo,
               double *lat_out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float cth [12];
  float inv_cth [12];
  float sth [12];
  double a [13];
  float f [13] [40];
  float g [13] [40];
  
  lVar10 = (long)orderCoef;
  lVar9 = 0;
  uVar11 = 0;
  if (0 < orderCoef) {
    uVar11 = (ulong)(uint)orderCoef;
  }
  for (; lVar9 != 6; lVar9 = lVar9 + 1) {
    a[0] = 1.0;
    memcpy(a + 1,filtcoeflo + lVar9 * (orderCoef + 1) + 1,lVar10 * 8);
    WebRtcIsac_Dir2Lat(a,orderCoef,sth,cth);
    fVar12 = (float)filtcoeflo[lVar9 * (orderCoef + 1)];
    for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
      fVar12 = fVar12 * cth[uVar4];
      inv_cth[uVar4] = 1.0 / cth[uVar4];
    }
    for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 1) {
      fVar1 = lat_in[lVar5];
      f[0][lVar5] = fVar1;
      g[0][lVar5] = fVar1;
    }
    lVar5 = 0x28;
    for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
      fVar1 = sth[uVar4];
      fVar2 = stateG[uVar4];
      fVar13 = (fVar1 * fVar2 + sth[lVar5]) * inv_cth[uVar4];
      f[0][lVar5] = fVar13;
      g[0][lVar5] = fVar2 * cth[uVar4] + fVar13 * fVar1;
      lVar5 = lVar5 + 0x28;
    }
    uVar4 = 0;
    pfVar6 = f[1] + 1;
    pfVar7 = g[1] + 1;
    while (uVar4 != uVar11) {
      fVar1 = inv_cth[uVar4];
      fVar2 = sth[uVar4];
      fVar13 = cth[uVar4];
      uVar4 = uVar4 + 1;
      for (lVar5 = -0x9c; lVar5 != 0; lVar5 = lVar5 + 4) {
        fVar3 = *(float *)((long)pfVar7 + lVar5 + -8);
        fVar14 = (fVar2 * fVar3 + *(float *)((long)pfVar6 + lVar5 + -4)) * fVar1;
        *(float *)((long)pfVar6 + lVar5 + 0x9c) = fVar14;
        *(float *)((long)pfVar7 + lVar5 + 0x9c) = fVar3 * fVar13 + fVar14 * fVar2;
      }
      pfVar7 = pfVar7 + 0x28;
      pfVar6 = pfVar6 + 0x28;
    }
    for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 1) {
      lat_out[lVar5] = (double)(f[lVar10][lVar5] * fVar12);
    }
    lVar5 = 0x27;
    for (lVar8 = 0; lVar8 <= lVar10; lVar8 = lVar8 + 1) {
      stateF[lVar8] = f[0][lVar5];
      stateG[lVar8] = g[0][lVar5];
      lVar5 = lVar5 + 0x28;
    }
    lat_in = lat_in + 0x28;
    lat_out = lat_out + 0x28;
  }
  return;
}

Assistant:

void WebRtcIsac_NormLatticeFilterMa(int orderCoef,
                                     float *stateF,
                                     float *stateG,
                                     float *lat_in,
                                     double *filtcoeflo,
                                     double *lat_out)
{
  int n,k,i,u,temp1;
  int ord_1 = orderCoef+1;
  float sth[MAX_AR_MODEL_ORDER];
  float cth[MAX_AR_MODEL_ORDER];
  float inv_cth[MAX_AR_MODEL_ORDER];
  double a[MAX_AR_MODEL_ORDER+1];
  float f[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN], g[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN];
  float gain1;

  for (u=0;u<SUBFRAMES;u++)
  {
    /* set the Direct Form coefficients */
    temp1 = u*ord_1;
    a[0] = 1;
    memcpy(a+1, filtcoeflo+temp1+1, sizeof(double) * (ord_1-1));

    /* compute lattice filter coefficients */
    WebRtcIsac_Dir2Lat(a,orderCoef,sth,cth);

    /* compute the gain */
    gain1 = (float)filtcoeflo[temp1];
    for (k=0;k<orderCoef;k++)
    {
      gain1 *= cth[k];
      inv_cth[k] = 1/cth[k];
    }

    /* normalized lattice filter */
    /*****************************/

    /* initial conditions */
    for (i=0;i<HALF_SUBFRAMELEN;i++)
    {
      f[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
      g[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
    }

    /* get the state of f&g for the first input, for all orders */
    for (i=1;i<ord_1;i++)
    {
      f[i][0] = inv_cth[i-1]*(f[i-1][0] + sth[i-1]*stateG[i-1]);
      g[i][0] = cth[i-1]*stateG[i-1] + sth[i-1]* f[i][0];
    }

    /* filtering */
    for(k=0;k<orderCoef;k++)
    {
      for(n=0;n<(HALF_SUBFRAMELEN-1);n++)
      {
        f[k+1][n+1] = inv_cth[k]*(f[k][n+1] + sth[k]*g[k][n]);
        g[k+1][n+1] = cth[k]*g[k][n] + sth[k]* f[k+1][n+1];
      }
    }

    for(n=0;n<HALF_SUBFRAMELEN;n++)
    {
      lat_out[n + u * HALF_SUBFRAMELEN] = gain1 * f[orderCoef][n];
    }

    /* save the states */
    for (i=0;i<ord_1;i++)
    {
      stateF[i] = f[i][HALF_SUBFRAMELEN-1];
      stateG[i] = g[i][HALF_SUBFRAMELEN-1];
    }
    /* process next frame */
  }

  return;
}